

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O0

bool __thiscall
brynet::net::WrapTcpService::_addSession
          (WrapTcpService *this,PTR *socket,
          vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
          *optionFuncs)

{
  _Invoker_type *this_00;
  size_t this_01;
  bool bVar1;
  reference __f;
  element_type *this_02;
  pointer this_03;
  element_type *this_04;
  AddSocketOptionFunc local_2a8;
  AddSocketOptionFunc local_288;
  DATA_CALLBACK local_268;
  AddSocketOptionFunc local_248;
  DISCONNECT_CALLBACK local_228;
  AddSocketOptionFunc local_208;
  ENTER_CALLBACK local_1e8;
  AddSocketOptionFunc local_1c8;
  unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter> local_1a8;
  function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> local_1a0;
  shared_ptr<brynet::net::SSLHelper> local_180;
  AddSocketOptionFunc local_170;
  undefined1 local_150 [8];
  AddSocketOptionFunc sslOption;
  anon_class_16_1_bbef8b3d msgCallback;
  anon_class_16_1_bbef8b3d closeCallback;
  anon_class_64_3_faec5c49 enterCallback;
  PTR sharedTCPService;
  SESSION_ENTER_CALLBACK userEnterCallback;
  PTR tmpSession;
  function<void_(brynet::net::AddSessionOption::Options_&)> *v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  *__range1;
  Options options;
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  *optionFuncs_local;
  PTR *socket_local;
  WrapTcpService *this_local;
  
  options.maxRecvBufferSize = (size_t)optionFuncs;
  AddSessionOption::Options::Options((Options *)&__range1);
  this_01 = options.maxRecvBufferSize;
  __end1 = std::
           vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
           ::begin((vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
                    *)options.maxRecvBufferSize);
  v = (function<void_(brynet::net::AddSessionOption::Options_&)> *)
      std::
      vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
      ::end((vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
             *)this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::function<void_(brynet::net::AddSessionOption::Options_&)>_*,_std::vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>_>
                                     *)&v), bVar1) {
    __f = __gnu_cxx::
          __normal_iterator<const_std::function<void_(brynet::net::AddSessionOption::Options_&)>_*,_std::vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>_>
          ::operator*(&__end1);
    bVar1 = std::operator!=(__f,(nullptr_t)0x0);
    if (bVar1) {
      std::function<void_(brynet::net::AddSessionOption::Options_&)>::operator()
                (__f,(Options *)&__range1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::function<void_(brynet::net::AddSessionOption::Options_&)>_*,_std::vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>_>
    ::operator++(&__end1);
  }
  TCPSession::Create();
  this_02 = std::
            __shared_ptr_access<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&userEnterCallback._M_invoker);
  TCPSession::setService(this_02,&this->mTCPService);
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            ((function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)> *)
             &sharedTCPService.
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)> *)&__range1);
  this_00 = &enterCallback.userEnterCallback._M_invoker;
  std::shared_ptr<brynet::net::TcpService>::shared_ptr
            ((shared_ptr<brynet::net::TcpService> *)this_00,&this->mTCPService);
  std::shared_ptr<brynet::net::TcpService>::shared_ptr
            ((shared_ptr<brynet::net::TcpService> *)
             &closeCallback.tmpSession.
              super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<brynet::net::TcpService> *)this_00);
  std::shared_ptr<brynet::net::TCPSession>::shared_ptr
            ((shared_ptr<brynet::net::TCPSession> *)
             &enterCallback.sharedTCPService.
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<brynet::net::TCPSession> *)&userEnterCallback._M_invoker);
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            ((function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)> *)
             &enterCallback.tmpSession.
              super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)> *)
             &sharedTCPService.
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<brynet::net::TCPSession>::shared_ptr
            ((shared_ptr<brynet::net::TCPSession> *)
             &msgCallback.tmpSession.
              super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<brynet::net::TCPSession> *)&userEnterCallback._M_invoker);
  std::shared_ptr<brynet::net::TCPSession>::shared_ptr
            ((shared_ptr<brynet::net::TCPSession> *)&sslOption._M_invoker,
             (shared_ptr<brynet::net::TCPSession> *)&userEnterCallback._M_invoker);
  std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::function
            ((function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)local_150);
  if (((byte)options.sslHelper.
             super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi & 1) != 0) {
    this_03 = std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::
              operator->(socket);
    bVar1 = TcpSocket::isServerSide(this_03);
    if (bVar1) {
      std::shared_ptr<brynet::net::SSLHelper>::shared_ptr
                (&local_180,(shared_ptr<brynet::net::SSLHelper> *)&options.enterCallback._M_invoker)
      ;
      TcpService::AddSocketOption::WithServerSideSSL(&local_170,&local_180);
      std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::operator=
                ((function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)local_150,
                 &local_170);
      std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::~function
                (&local_170);
      std::shared_ptr<brynet::net::SSLHelper>::~shared_ptr(&local_180);
    }
    else {
      TcpService::AddSocketOption::WithClientSideSSL();
      std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::operator=
                ((function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)local_150,
                 &local_1a0);
      std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::~function
                (&local_1a0);
    }
  }
  this_04 = std::
            __shared_ptr_access<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->mTCPService);
  std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::unique_ptr
            (&local_1a8,socket);
  std::function<void(long,std::__cxx11::string_const&)>::
  function<brynet::net::WrapTcpService::_addSession(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>,std::vector<std::function<void(brynet::net::AddSessionOption::Options&)>,std::allocator<std::function<void(brynet::net::AddSessionOption::Options&)>>>const&)::__0&,void>
            ((function<void(long,std::__cxx11::string_const&)> *)&local_1e8,
             (anon_class_64_3_faec5c49 *)
             &closeCallback.tmpSession.
              super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  TcpService::AddSocketOption::WithEnterCallback(&local_1c8,&local_1e8);
  std::function<void(long)>::
  function<brynet::net::WrapTcpService::_addSession(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>,std::vector<std::function<void(brynet::net::AddSessionOption::Options&)>,std::allocator<std::function<void(brynet::net::AddSessionOption::Options&)>>>const&)::__1&,void>
            ((function<void(long)> *)&local_228,
             (anon_class_16_1_bbef8b3d *)
             &msgCallback.tmpSession.
              super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  TcpService::AddSocketOption::WithDisconnectCallback(&local_208,&local_228);
  std::function<unsigned_long(long,char_const*,unsigned_long)>::
  function<brynet::net::WrapTcpService::_addSession(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>,std::vector<std::function<void(brynet::net::AddSessionOption::Options&)>,std::allocator<std::function<void(brynet::net::AddSessionOption::Options&)>>>const&)::__2&,void>
            ((function<unsigned_long(long,char_const*,unsigned_long)> *)&local_268,
             (anon_class_16_1_bbef8b3d *)&sslOption._M_invoker);
  TcpService::AddSocketOption::WithDataCallback(&local_248,&local_268);
  TcpService::AddSocketOption::WithMaxRecvBufferSize(&local_288,options._48_8_);
  TcpService::AddSocketOption::WithForceSameThreadLoop
            (&local_2a8,
             (bool)(options.sslHelper.
                    super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._1_1_ & 1));
  bVar1 = TcpService::
          addDataSocket<std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>>
                    (this_04,&local_1a8,
                     (function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)
                     local_150,&local_1c8,&local_208,&local_248,&local_288,&local_2a8);
  std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::~function(&local_2a8);
  std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::~function(&local_288);
  std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::~function(&local_248);
  std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::~function(&local_268);
  std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::~function(&local_208);
  std::function<void_(long)>::~function(&local_228);
  std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::~function(&local_1c8);
  std::
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1e8);
  std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::~unique_ptr
            (&local_1a8);
  std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::~function
            ((function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)local_150);
  _addSession(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>,std::vector<std::function<void(brynet::net::AddSessionOption::Options&)>,std::allocator<std::function<void(brynet::net::AddSessionOption::Options&)>>>const&)
  ::$_2::~__2((__2 *)&sslOption._M_invoker);
  _addSession(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>,std::vector<std::function<void(brynet::net::AddSessionOption::Options&)>,std::allocator<std::function<void(brynet::net::AddSessionOption::Options&)>>>const&)
  ::$_1::~__1((__1 *)&msgCallback.tmpSession.
                      super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  _addSession(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>,std::vector<std::function<void(brynet::net::AddSessionOption::Options&)>,std::allocator<std::function<void(brynet::net::AddSessionOption::Options&)>>>const&)
  ::$_0::~__0((__0 *)&closeCallback.tmpSession.
                      super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  std::shared_ptr<brynet::net::TcpService>::~shared_ptr
            ((shared_ptr<brynet::net::TcpService> *)&enterCallback.userEnterCallback._M_invoker);
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::~function
            ((function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)> *)
             &sharedTCPService.
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<brynet::net::TCPSession>::~shared_ptr
            ((shared_ptr<brynet::net::TCPSession> *)&userEnterCallback._M_invoker);
  AddSessionOption::Options::~Options((Options *)&__range1);
  return bVar1;
}

Assistant:

bool WrapTcpService::_addSession(TcpSocket::PTR socket,
    const std::vector<AddSessionOption::AddSessionOptionFunc>& optionFuncs)
{
    struct AddSessionOption::Options options;
    for (const auto& v : optionFuncs)
    {
        if (v != nullptr)
        {
            v(options);
        }
    }

    auto tmpSession = TCPSession::Create();
    tmpSession->setService(mTCPService);

    auto userEnterCallback = options.enterCallback;
    auto sharedTCPService = mTCPService;
    auto enterCallback = [sharedTCPService,
        tmpSession,
        userEnterCallback](TcpService::SESSION_TYPE id,
            const std::string& ip) mutable {
        tmpSession->setIOLoopData(sharedTCPService->getIOLoopDataBySocketID(id));
        tmpSession->setSocketID(id);
        tmpSession->setIP(ip);
        if (userEnterCallback != nullptr)
        {
            userEnterCallback(tmpSession);
        }
    };

    auto closeCallback = [tmpSession](TcpService::SESSION_TYPE id) mutable {
        const auto& callback = tmpSession->getCloseCallback();
        if (callback != nullptr)
        {
            callback(tmpSession);
        }
    };

    auto msgCallback = [tmpSession](TcpService::SESSION_TYPE id,
        const char* buffer,
        size_t len) mutable {
        const auto& callback = tmpSession->getDataCallback();
        if (callback != nullptr)
        {
            return callback(tmpSession, buffer, len);
        }
        else
        {
            return static_cast<size_t>(0);
        }
    };

    TcpService::AddSocketOption::AddSocketOptionFunc sslOption;
    if (options.useSSL)
    {
        if (socket->isServerSide())
        {
            sslOption = TcpService::AddSocketOption::WithServerSideSSL(options.sslHelper);
        }
        else
        {
            sslOption = TcpService::AddSocketOption::WithClientSideSSL();
        }
    }

    return mTCPService->addDataSocket(std::move(socket),
        sslOption,
        TcpService::AddSocketOption::WithEnterCallback(enterCallback),
        TcpService::AddSocketOption::WithDisconnectCallback(closeCallback),
        TcpService::AddSocketOption::WithDataCallback(msgCallback),
        TcpService::AddSocketOption::WithMaxRecvBufferSize(options.maxRecvBufferSize),
        TcpService::AddSocketOption::WithForceSameThreadLoop(options.forceSameThreadLoop));
}